

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O0

int Gia_ManFromBridgeReadPackage(FILE *pFile,int *pType,int *pSize,uchar **ppBuffer)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  char local_48 [4];
  int RetValue;
  char Temp [24];
  uchar **ppBuffer_local;
  int *pSize_local;
  int *pType_local;
  FILE *pFile_local;
  
  Temp._16_8_ = ppBuffer;
  sVar2 = fread(local_48,0x18,1,(FILE *)pFile);
  if ((int)sVar2 == 1) {
    RetValue._2_1_ = 0;
    Temp[0xf] = '\0';
    iVar1 = atoi(local_48);
    *pType = iVar1;
    iVar1 = atoi((char *)((long)&RetValue + 3));
    *pSize = iVar1;
    pvVar3 = malloc((long)*pSize);
    *(void **)Temp._16_8_ = pvVar3;
    sVar2 = fread(*(void **)Temp._16_8_,(long)*pSize,1,(FILE *)pFile);
    if (((int)sVar2 == 1) || (*pSize == 0)) {
      pFile_local._4_4_ = 1;
    }
    else {
      if (*(long *)Temp._16_8_ != 0) {
        free(*(void **)Temp._16_8_);
        *(undefined8 *)Temp._16_8_ = 0;
      }
      printf("Gia_ManFromBridgeReadPackage();  Error 2: Something is wrong!\n");
      pFile_local._4_4_ = 0;
    }
  }
  else {
    printf("Gia_ManFromBridgeReadPackage();  Error 1: Something is wrong!\n");
    pFile_local._4_4_ = 0;
  }
  return pFile_local._4_4_;
}

Assistant:

int Gia_ManFromBridgeReadPackage( FILE * pFile, int * pType, int * pSize, unsigned char ** ppBuffer )
{
    char Temp[24];
    int RetValue;
    RetValue = fread( Temp, 24, 1, pFile );
    if ( RetValue != 1 )
    {
        printf( "Gia_ManFromBridgeReadPackage();  Error 1: Something is wrong!\n" );
        return 0;
    }
    Temp[6] = 0;
    Temp[23]= 0;

    *pType = atoi( Temp );
    *pSize = atoi( Temp + 7 );

    *ppBuffer = ABC_ALLOC( unsigned char, *pSize );
    RetValue = fread( *ppBuffer, *pSize, 1, pFile );
    if ( RetValue != 1 && *pSize != 0 )
    {
        ABC_FREE( *ppBuffer );
        printf( "Gia_ManFromBridgeReadPackage();  Error 2: Something is wrong!\n" );
        return 0;
    }
    return 1;
}